

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_buffered_stream.h
# Opt level: O0

void __thiscall
google::protobuf::json_internal::ZeroCopyBufferedStream::ZeroCopyBufferedStream
          (ZeroCopyBufferedStream *this,ZeroCopyInputStream *stream)

{
  ZeroCopyInputStream *stream_local;
  ZeroCopyBufferedStream *this_local;
  
  this->stream_ = stream;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&this->last_chunk_);
  std::vector<char,_std::allocator<char>_>::vector(&this->buf_);
  this->using_buf_ = false;
  this->cursor_ = 0;
  this->buffer_start_ = 0;
  this->eof_ = false;
  this->outstanding_buffer_borrows_ = 0;
  return;
}

Assistant:

explicit ZeroCopyBufferedStream(io::ZeroCopyInputStream* stream)
      : stream_(stream) {}